

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O0

void __thiscall irr::scene::CMeshSceneNode::render(CMeshSceneNode *this)

{
  SMaterial *pSVar1;
  int iVar2;
  uint uVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  long in_RDI;
  u32 g_1;
  u32 i_1;
  u32 count;
  SColor debugNormalColor;
  f32 debugNormalLength;
  u32 g;
  SMaterial m;
  bool transparent;
  SMaterial *material;
  IMeshBuffer *mb;
  u32 i;
  bool isTransparentPass;
  IVideoDriver *driver;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  uint uVar7;
  SMaterial *in_stack_fffffffffffffeb0;
  SMaterial *local_128;
  uint local_10c;
  int local_104;
  SColor local_fc;
  undefined4 local_f8;
  SColor local_f4;
  uint local_f0;
  SColor local_ec;
  undefined1 local_e8 [161];
  undefined1 local_47;
  ushort local_38;
  byte local_29;
  SMaterial *local_28;
  undefined8 *local_20;
  uint local_18;
  byte local_11;
  SMaterial *local_10;
  
  local_10 = (SMaterial *)(**(code **)(**(long **)(in_RDI + 200) + 0x10))();
  if ((*(long *)(in_RDI + 0x1d0) != 0) && (local_10 != (SMaterial *)0x0)) {
    iVar2 = (**(code **)(**(long **)(in_RDI + 200) + 0xe0))();
    local_11 = iVar2 == 0x10;
    *(int *)(in_RDI + 0x1d8) = *(int *)(in_RDI + 0x1d8) + 1;
    (*(code *)((local_10->TextureLayers[0].Texture)->NamedPath).InternalName.str._M_string_length)
              (local_10,1,in_RDI + 0x30);
    puVar4 = (undefined8 *)(**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))();
    *(undefined8 *)(in_RDI + 0x100) = *puVar4;
    *(undefined8 *)(in_RDI + 0x108) = puVar4[1];
    *(undefined8 *)(in_RDI + 0x110) = puVar4[2];
    for (local_18 = 0; uVar7 = local_18, uVar3 = (**(code **)**(undefined8 **)(in_RDI + 0x1d0))(),
        uVar7 < uVar3; local_18 = local_18 + 1) {
      local_20 = (undefined8 *)
                 (**(code **)(**(long **)(in_RDI + 0x1d0) + 8))(*(long **)(in_RDI + 0x1d0),local_18)
      ;
      if (local_20 != (undefined8 *)0x0) {
        if ((*(byte *)(in_RDI + 0x1dc) & 1) == 0) {
          local_128 = core::array<irr::video::SMaterial>::operator[]
                                ((array<irr::video::SMaterial> *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 (u32)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        }
        else {
          local_128 = (SMaterial *)(**(code **)*local_20)();
        }
        local_28 = local_128;
        local_29 = (**(code **)&local_10->TextureLayers[0].Texture[5].HasMipMaps)
                             (local_10,local_128);
        local_29 = local_29 & 1;
        if (local_29 == (local_11 & 1)) {
          (**(code **)&(local_10->TextureLayers[0].Texture)->ColorFormat)(local_10,local_28);
          (*(code *)local_10->TextureLayers[0].Texture[3]._vptr_ITexture)(local_10,local_20);
        }
      }
    }
    if ((*(int *)(in_RDI + 0xd8) != 0) && (*(int *)(in_RDI + 0x1d8) == 1)) {
      video::SMaterial::SMaterial(in_stack_fffffffffffffeb0);
      local_38 = local_38 & 0xfff7;
      local_47 = 0;
      (**(code **)&(local_10->TextureLayers[0].Texture)->ColorFormat)(local_10,local_e8);
      pSVar1 = local_10;
      if ((*(uint *)(in_RDI + 0xd8) & 1) != 0) {
        video::SColor::SColor(&local_ec,0xff,0xff,0xff,0xff);
        (*(code *)pSVar1->TextureLayers[0].Texture[2].Size)(pSVar1,in_RDI + 0x100,local_ec.color);
      }
      if ((*(uint *)(in_RDI + 0xd8) & 0x20) != 0) {
        for (local_f0 = 0; uVar7 = local_f0,
            uVar3 = (**(code **)**(undefined8 **)(in_RDI + 0x1d0))(), uVar7 < uVar3;
            local_f0 = local_f0 + 1) {
          in_stack_fffffffffffffeb0 = local_10;
          plVar5 = (long *)(**(code **)(**(long **)(in_RDI + 0x1d0) + 8))
                                     (*(long **)(in_RDI + 0x1d0),local_f0);
          uVar6 = (**(code **)(*plVar5 + 0x50))();
          video::SColor::SColor(&local_f4,0xff,0xbe,0x80,0x80);
          (*(code *)in_stack_fffffffffffffeb0->TextureLayers[0].Texture[2].Size)
                    (in_stack_fffffffffffffeb0,uVar6,local_f4.color);
        }
      }
      if ((*(uint *)(in_RDI + 0xd8) & 2) != 0) {
        local_f8 = 0x3f800000;
        video::SColor::SColor(&local_fc,0xff,0x22,0xdd,0xdd);
        iVar2 = (**(code **)**(undefined8 **)(in_RDI + 0x1d0))();
        for (local_104 = 0; pSVar1 = local_10, local_104 != iVar2; local_104 = local_104 + 1) {
          uVar6 = (**(code **)(**(long **)(in_RDI + 0x1d0) + 8))
                            (*(long **)(in_RDI + 0x1d0),local_104);
          (**(code **)&pSVar1->TextureLayers[0].Texture[3].NamedPath.Path.str)
                    (0x3f800000,pSVar1,uVar6,local_fc.color);
        }
      }
      if ((*(uint *)(in_RDI + 0xd8) & 8) != 0) {
        local_38 = local_38 & 0xfffe | 1;
        (**(code **)&(local_10->TextureLayers[0].Texture)->ColorFormat)(local_10,local_e8);
        local_10c = 0;
        while (uVar7 = local_10c, uVar3 = (**(code **)**(undefined8 **)(in_RDI + 0x1d0))(),
              pSVar1 = local_10, uVar7 < uVar3) {
          uVar6 = (**(code **)(**(long **)(in_RDI + 0x1d0) + 8))
                            (*(long **)(in_RDI + 0x1d0),local_10c);
          (*(code *)pSVar1->TextureLayers[0].Texture[3]._vptr_ITexture)(pSVar1,uVar6);
          local_10c = local_10c + 1;
        }
      }
      video::SMaterial::~SMaterial(in_stack_fffffffffffffeb0);
    }
  }
  return;
}

Assistant:

void CMeshSceneNode::render()
{
	video::IVideoDriver *driver = SceneManager->getVideoDriver();

	if (!Mesh || !driver)
		return;

	const bool isTransparentPass =
			SceneManager->getSceneNodeRenderPass() == scene::ESNRP_TRANSPARENT;

	++PassCount;

	driver->setTransform(video::ETS_WORLD, AbsoluteTransformation);
	Box = Mesh->getBoundingBox();

	for (u32 i = 0; i < Mesh->getMeshBufferCount(); ++i) {
		scene::IMeshBuffer *mb = Mesh->getMeshBuffer(i);
		if (mb) {
			const video::SMaterial &material = ReadOnlyMaterials ? mb->getMaterial() : Materials[i];

			const bool transparent = driver->needsTransparentRenderPass(material);

			// only render transparent buffer if this is the transparent render pass
			// and solid only in solid pass
			if (transparent == isTransparentPass) {
				driver->setMaterial(material);
				driver->drawMeshBuffer(mb);
			}
		}
	}

	// for debug purposes only:
	if (DebugDataVisible && PassCount == 1) {
		video::SMaterial m;
		m.Lighting = false;
		m.AntiAliasing = 0;
		driver->setMaterial(m);

		if (DebugDataVisible & scene::EDS_BBOX) {
			driver->draw3DBox(Box, video::SColor(255, 255, 255, 255));
		}
		if (DebugDataVisible & scene::EDS_BBOX_BUFFERS) {
			for (u32 g = 0; g < Mesh->getMeshBufferCount(); ++g) {
				driver->draw3DBox(
						Mesh->getMeshBuffer(g)->getBoundingBox(),
						video::SColor(255, 190, 128, 128));
			}
		}

		if (DebugDataVisible & scene::EDS_NORMALS) {
			// draw normals
			const f32 debugNormalLength = 1.f;
			const video::SColor debugNormalColor = video::SColor(255, 34, 221, 221);
			const u32 count = Mesh->getMeshBufferCount();

			for (u32 i = 0; i != count; ++i) {
				driver->drawMeshBufferNormals(Mesh->getMeshBuffer(i), debugNormalLength, debugNormalColor);
			}
		}

		// show mesh
		if (DebugDataVisible & scene::EDS_MESH_WIRE_OVERLAY) {
			m.Wireframe = true;
			driver->setMaterial(m);

			for (u32 g = 0; g < Mesh->getMeshBufferCount(); ++g) {
				driver->drawMeshBuffer(Mesh->getMeshBuffer(g));
			}
		}
	}
}